

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

int __thiscall Qentem::QTest::EndTests(QTest *this)

{
  bool bVar1;
  char *local_38;
  char *local_30;
  char *local_28;
  
  bVar1 = this->error_ == false;
  if (bVar1) {
    local_28 = TestOutPut::GetColor(TITLE);
    local_30 = TestOutPut::GetColor(PASS);
    local_38 = TestOutPut::GetColor(END);
    TestOutPut::Print<char_const*,char_const*,char_const*,char[18],char_const*,char[3]>
              (&local_28,&this->test_name_,&local_30,(char (*) [18])" Passed all tests",&local_38,
               (char (*) [3])0x1168d2);
  }
  return (uint)!bVar1;
}

Assistant:

QENTEM_NOINLINE int EndTests() {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), test_name_,
                              TestOutPut::GetColor(TestOutPut::Colors::PASS), " Passed all tests",
                              TestOutPut::GetColor(TestOutPut::Colors::END), "\n\n");
            return 0;
        }

        return 1;
    }